

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Plugin.cpp
# Opt level: O2

void __thiscall RenX::Plugin::~Plugin(Plugin *this)

{
  Core *pCVar1;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar2;
  const_iterator __position;
  
  *(undefined ***)this = &PTR_think_00165348;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00165828;
  pCVar1 = getCore();
  pvVar2 = Core::getPlugins(pCVar1);
  __position._M_current =
       (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00133593:
      Jupiter::Plugin::~Plugin(&this->super_Plugin);
      return;
    }
    if (*__position._M_current == this) {
      pCVar1 = getCore();
      pvVar2 = Core::getPlugins(pCVar1);
      std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::erase(pvVar2,__position);
      goto LAB_00133593;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

RenX::Plugin::~Plugin() {
	auto& renx_plugins = RenX::getCore()->getPlugins();
	for (auto itr = renx_plugins.begin(); itr != renx_plugins.end(); ++itr) {
		if (*itr == this) {
			RenX::getCore()->getPlugins().erase(itr);
			break;
		}
	}
}